

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Builder::Builder
          (Builder *this,shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *buffer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Exception *this_00;
  
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (buffer->
           super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (buffer->
           super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (buffer->
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (buffer->
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  peVar1 = (this->_buffer).
           super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this->_bufferPtr = peVar1;
  this->_start = (uint8_t *)0x0;
  this->_pos = 0;
  (this->_arena).ptr_ = (this->_arena).buf_;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Tp_alloc_type.a_ = &this->_arena;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_keyWritten = false;
  this->options = &Options::Defaults;
  if (peVar1 != (element_type *)0x0) {
    this->_start = peVar1->_buffer;
    this->_pos = peVar1->_size;
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::reserve(&this->_stack,4);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InternalError,"Buffer cannot be a nullptr");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Builder::Builder(std::shared_ptr<Buffer<uint8_t>> buffer)
    : _buffer(std::move(buffer)),
      _bufferPtr(_buffer.get()),
      _start(nullptr),
      _pos(0),
      _arena(),
      _stack(_arena),
      _keyWritten(false),
      options(&Options::Defaults) {
  if (VELOCYPACK_UNLIKELY(_bufferPtr == nullptr)) {
    throw Exception(Exception::InternalError, "Buffer cannot be a nullptr");
  }
  _start = _bufferPtr->data();
  _pos = _bufferPtr->size();

  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
}